

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescale_freqs.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_iterator cVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  directory_iterator i;
  string short_name;
  string file_name;
  smatch what;
  directory_iterator end_itr;
  path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  variables_map cmdargs;
  directory_iterator local_270;
  undefined1 local_268 [8];
  shared_count sStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  shared_count sStack_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 auStack_218 [56];
  int local_1e0;
  bool local_1dc;
  basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> local_1d8;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_1c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  error_code local_198;
  undefined1 local_188 [16];
  name *local_178;
  element_type *local_170;
  name local_168 [2];
  string local_158;
  long *local_138;
  long local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  parse_cmdargs((int)local_d0,(char **)(ulong)(uint)argc);
  local_228._0_8_ = (element_type *)auStack_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"input","");
  operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar3 = boost::any_cast<std::__cxx11::string_const&>(operand);
  local_178 = local_168;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar1,pcVar1 + pbVar3->_M_string_length);
  if ((element_type *)local_228._0_8_ != (element_type *)auStack_218) {
    operator_delete((void *)local_228._0_8_,CONCAT71(auStack_218._1_7_,auStack_218[0]) + 1);
  }
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            (&local_1d8,".*\\.u32",0);
  local_228._0_8_ = (element_type *)auStack_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"text","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_228);
  if ((element_type *)local_228._0_8_ != (element_type *)auStack_218) {
    operator_delete((void *)local_228._0_8_,CONCAT71(auStack_218._1_7_,auStack_218[0]) + 1);
  }
  if (cVar4._M_node != &local_b8) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                &local_198,".*\\.txt",0);
    local_228._8_8_ = local_1d8.m_pimpl.pn.pi_;
    local_228._0_8_ = local_1d8.m_pimpl.px;
    if ((sp_counted_base *)local_198.cat_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)&(local_198.cat_)->id_ = *(uint_least32_t *)&(local_198.cat_)->id_ + 1;
      UNLOCK();
    }
    local_1d8.m_pimpl.px = (element_type *)local_198._0_8_;
    local_1d8.m_pimpl.pn.pi_ = (sp_counted_base *)local_198.cat_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_228 + 8));
    boost::detail::shared_count::~shared_count((shared_count *)&local_198.cat_);
  }
  local_198._0_8_ = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_178,(long)&local_178->index + (long)local_170);
  boost::filesystem::detail::status((path *)local_228,&local_198);
  if (local_228._0_4_ == 2) {
    boost::filesystem::path::filename();
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)
               local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,0);
    sStack_240.pi_ = local_1d8.m_pimpl.pn.pi_;
    local_248._M_current = (char *)local_1d8.m_pimpl.px;
    if (sStack_260.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_260.pi_)->use_count_ = (sStack_260.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_1d8.m_pimpl.px = (element_type *)local_268;
    local_1d8.m_pimpl.pn.pi_ = sStack_260.pi_;
    boost::detail::shared_count::~shared_count(&sStack_240);
    boost::detail::shared_count::~shared_count((shared_count *)(local_268 + 8));
    if ((element_type *)local_228._0_8_ != (element_type *)auStack_218) {
      operator_delete((void *)local_228._0_8_,CONCAT71(auStack_218._1_7_,auStack_218[0]) + 1);
    }
    boost::filesystem::path::parent_path();
    std::__cxx11::string::_M_assign((string *)&local_178);
    if ((element_type *)local_228._0_8_ != (element_type *)auStack_218) {
      operator_delete((void *)local_228._0_8_,CONCAT71(auStack_218._1_7_,auStack_218[0]) + 1);
    }
  }
  local_1c0.px = (dir_itr_imp *)0x0;
  local_228._0_8_ = (element_type *)auStack_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_178,(long)&local_178->index + (long)local_170);
  boost::filesystem::directory_iterator::directory_iterator(&local_270,(path *)local_228,none);
  if ((element_type *)local_228._0_8_ != (element_type *)auStack_218) {
    operator_delete((void *)local_228._0_8_,CONCAT71(auStack_218._1_7_,auStack_218[0]) + 1);
  }
  do {
    if ((local_270.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_1c0.px)
       || (((local_270.m_imp.px == (dir_itr_imp *)0x0 ||
            (*(long *)((long)local_270.m_imp.px + 0x38) == 0)) &&
           ((local_1c0.px == (dir_itr_imp *)0x0 || (*(long *)(local_1c0.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_270.m_imp)
      ;
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_1c0);
      if ((element_type *)local_198._0_8_ != (element_type *)local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
      }
      boost::detail::shared_count::~shared_count(&local_1d8.m_pimpl.pn);
      if (local_178 != local_168) {
        operator_delete(local_178,(long)local_168[0] + 1);
      }
      local_d0[0] = std::logic_error::logic_error;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(local_c0);
      return 0;
    }
    boost::filesystem::directory_entry::get_status((error_code *)local_d8);
    if (local_d8._0_4_ == 2) {
      auStack_218[0x10] = 0;
      auStack_218._17_8_ = 0;
      auStack_218._25_8_ = 0;
      local_228._0_8_ = (element_type *)0x0;
      local_228._8_8_ = (pointer)0x0;
      auStack_218[0] = '\0';
      auStack_218._1_7_ = 0;
      auStack_218[8] = '\0';
      auStack_218._9_7_ = 0;
      auStack_218._40_16_ = ZEXT416(0) << 0x40;
      local_1e0 = 0;
      local_1dc = true;
      boost::filesystem::path::filename();
      bVar2 = boost::
              regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (local_248,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_248._M_current + (long)&(sStack_240.pi_)->_vptr_sp_counted_base),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_228,&local_1d8,format_default);
      if ((element_type *)local_248._M_current != (element_type *)local_238) {
        operator_delete(local_248._M_current,(ulong)((long)(int *)local_238._0_8_ + 1));
      }
      if (bVar2) {
        local_248._M_current = local_238;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,*(long *)((long)local_270.m_imp.px + 8),
                   *(long *)((long)local_270.m_imp.px + 0x10) +
                   *(long *)((long)local_270.m_imp.px + 8));
        local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_268 = (undefined1  [8])&local_258;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"text","");
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)local_268);
        if (local_268 != (undefined1  [8])&local_258) {
          operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
        }
        if (cVar4._M_node == &local_b8) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_248._M_current,
                     (uchar *)((long)&sStack_240.pi_[-6].weak_count_ +
                              (long)((regex_data<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                                      *)local_248._M_current)->m_startmap));
          read_file_u32((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_268,&local_118)
          ;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_258._M_allocated_capacity;
          local_258._M_allocated_capacity = 0;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_268;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)sStack_260.pi_;
          _local_268 = ZEXT816(0) << 0x20;
          uVar5 = local_118.field_2._M_allocated_capacity;
          _Var6._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_001239e6;
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_248._M_current,
                     (uchar *)((long)&sStack_240.pi_[-6].weak_count_ +
                              (long)((regex_data<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                                      *)local_248._M_current)->m_startmap));
          read_file_text((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_268,&local_f8)
          ;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_258._M_allocated_capacity;
          local_258._M_allocated_capacity = 0;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_268;
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)sStack_260.pi_;
          _local_268 = ZEXT816(0) << 0x20;
          uVar5 = local_f8.field_2._M_allocated_capacity;
          _Var6._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_001239e6:
            local_258._M_allocated_capacity = 0;
            operator_delete(_Var6._M_p,uVar5 + 1);
          }
        }
        boost::filesystem::path::stem();
        local_268 = (undefined1  [8])&local_258;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,local_138,local_130 + (long)local_138);
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_268,(pointer)((long)local_268 + (long)sStack_260.pi_))
        ;
        rescale_freqs(&local_1b8,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != (undefined1  [8])&local_258) {
          operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
        }
        if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((element_type *)local_248._M_current != (element_type *)local_238) {
          operator_delete(local_248._M_current,(ulong)((long)(int *)local_238._0_8_ + 1));
        }
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_228);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_270,(error_code *)0x0);
  } while( true );
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        rescale_freqs(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}